

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  secp256k1_scalar *r;
  secp256k1_fe *r_00;
  int extraout_EAX;
  uint32_t uVar1;
  uint32_t uVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  secp256k1_gej *psVar3;
  secp256k1_gej *psVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  secp256k1_scalar *a;
  int iVar10;
  secp256k1_ge *unaff_RBX;
  long lVar11;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *psVar12;
  secp256k1_fe *psVar13;
  secp256k1_ge *psVar14;
  ulong uVar15;
  secp256k1_gej *psVar16;
  uint64_t *puVar17;
  secp256k1_ge *psVar18;
  uint64_t *puVar19;
  secp256k1_gej *psVar20;
  int iVar21;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar22;
  long unaff_R13;
  secp256k1_ge *unaff_R14;
  secp256k1_ge *psVar23;
  uint uVar24;
  secp256k1_gej *unaff_R15;
  bool bVar25;
  byte bVar26;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_fe sStack_f30;
  undefined1 auStack_f00 [144];
  undefined1 auStack_e70 [112];
  secp256k1_ge sStack_e00;
  secp256k1_fe asStack_d68 [31];
  secp256k1_ge sStack_780;
  secp256k1_fe asStack_6e8 [31];
  secp256k1_ge *psStack_f8;
  secp256k1_gej *psStack_f0;
  long lStack_e8;
  secp256k1_ge *psStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_d0;
  undefined8 uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  secp256k1_ge *local_a8;
  secp256k1_gej *psStack_a0;
  ulong local_98;
  secp256k1_ge *local_90;
  ulong local_88;
  secp256k1_ge *local_80;
  undefined1 local_78 [40];
  secp256k1_modinv64_trans2x2 local_50;
  
  bVar26 = 0;
  local_78._32_8_ = (modinfo->modulus).v[4];
  local_78._0_8_ = (modinfo->modulus).v[0];
  local_78._8_8_ = (modinfo->modulus).v[1];
  local_78._16_8_ = (modinfo->modulus).v[2];
  local_78._24_8_ = (modinfo->modulus).v[3];
  local_b8 = x->v[0];
  uStack_b0 = x->v[1];
  local_a8 = (secp256k1_ge *)x->v[2];
  psStack_a0 = (secp256k1_gej *)x->v[3];
  local_98 = x->v[4];
  psVar14 = (secp256k1_ge *)modinfo;
  if (((((long)local_b8 < 0) || ((long)uStack_b0 < 0)) ||
      (unaff_RBX = (secp256k1_ge *)modinfo, psVar14 = local_a8, (long)local_a8 < 0)) ||
     ((x = (secp256k1_modinv64_signed62 *)psStack_a0, (long)psStack_a0 < 0 || ((long)local_98 < 0)))
     ) {
LAB_00149fe3:
    psStack_d0 = (secp256k1_gej *)0x149fe8;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_00149fe8:
    psStack_d0 = (secp256k1_gej *)0x149fed;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00149fed:
    psStack_d0 = (secp256k1_gej *)0x149ff2;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00149ff2:
    psStack_d0 = (secp256k1_gej *)0x149ff7;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00149ff7:
    psStack_d0 = (secp256k1_gej *)0x149ffc;
    secp256k1_jacobi64_maybe_var_cold_8();
    modinfo = (secp256k1_modinv64_modinfo *)unaff_RBX;
    psVar22 = unaff_R12;
    psVar23 = unaff_R14;
  }
  else {
    psVar14 = (secp256k1_ge *)
              ((ulong)local_a8 | (ulong)psStack_a0 | uStack_b0 | local_b8 | local_98);
    psVar22 = unaff_R12;
    psVar23 = unaff_R14;
    if (psVar14 != (secp256k1_ge *)0x0) {
      unaff_R14 = (secp256k1_ge *)0x5;
      unaff_R13 = -1;
      local_88 = 0;
      unaff_RBP = (secp256k1_gej *)0x0;
      local_90 = (secp256k1_ge *)modinfo;
      do {
        unaff_RBX = local_90;
        x = (secp256k1_modinv64_signed62 *)(local_78._8_8_ << 0x3e | local_78._0_8_);
        puVar17 = (uint64_t *)(uStack_b0 << 0x3e | local_b8);
        psVar3 = (secp256k1_gej *)0x0;
        psVar18 = (secp256k1_ge *)0x0;
        psVar22 = (secp256k1_gej *)0x1;
        iVar7 = 0x3e;
        psVar23 = (secp256k1_ge *)0x1;
        puVar19 = puVar17;
        psVar16 = (secp256k1_gej *)x;
        while( true ) {
          uVar15 = -1L << ((byte)iVar7 & 0x3f) | (ulong)puVar19;
          lVar11 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          bVar5 = (byte)lVar11;
          psVar20 = (secp256k1_gej *)((ulong)puVar19 >> (bVar5 & 0x3f));
          psVar23 = (secp256k1_ge *)((long)psVar23 << (bVar5 & 0x3f));
          psVar3 = (secp256k1_gej *)((long)psVar3 << (bVar5 & 0x3f));
          unaff_R13 = unaff_R13 - lVar11;
          psVar14 = (secp256k1_ge *)((ulong)psVar16 >> 2);
          uVar24 = ((uint)((ulong)psVar16 >> 1) ^ (uint)psVar14) & (uint)lVar11 ^ (uint)unaff_RBP;
          unaff_R15 = (secp256k1_gej *)(ulong)uVar24;
          iVar7 = iVar7 - (uint)lVar11;
          local_80 = unaff_R14;
          if (iVar7 == 0) break;
          if (((ulong)psVar16 & 1) == 0) {
            psStack_d0 = (secp256k1_gej *)0x149fb1;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00149fb1:
            psStack_d0 = (secp256k1_gej *)0x149fb6;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00149fb6:
            psStack_d0 = (secp256k1_gej *)0x149fbb;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00149fbb:
            psStack_d0 = (secp256k1_gej *)0x149fc0;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00149fc0;
          }
          if (((ulong)psVar20 & 1) == 0) goto LAB_00149fb1;
          psVar14 = (secp256k1_ge *)((long)psVar3 * (long)puVar17 + (long)psVar23 * (long)x);
          bVar5 = 0x3e - (char)iVar7;
          modinfo = (secp256k1_modinv64_modinfo *)((long)psVar16 << (bVar5 & 0x3f));
          if (psVar14 != (secp256k1_ge *)modinfo) goto LAB_00149fb6;
          modinfo = (secp256k1_modinv64_modinfo *)
                    ((long)psVar22 * (long)puVar17 + (long)psVar18 * (long)x);
          psVar14 = (secp256k1_ge *)((long)psVar20 << (bVar5 & 0x3f));
          if ((secp256k1_ge *)modinfo != psVar14) goto LAB_00149fbb;
          iVar21 = (int)psVar16;
          iVar10 = (int)psVar20;
          if (unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar6 = (int)unaff_R13 + 1;
            if (iVar7 <= iVar6) {
              iVar6 = iVar7;
            }
            psVar14 = (secp256k1_ge *)(ulong)(iVar6 - 0x3fU);
            if (0xffffffc1 < iVar6 - 0x3fU) {
              unaff_RBP = (secp256k1_gej *)
                          (ulong)(uVar24 ^ (uint)(((ulong)psVar20 & (ulong)psVar16) >> 1));
              modinfo = (secp256k1_modinv64_modinfo *)
                        ((ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
              uVar24 = (iVar10 * iVar10 + 0x3e) * iVar10 * iVar21 & (uint)modinfo;
              psVar4 = psVar3;
              psVar3 = psVar22;
              psVar12 = psVar20;
              psVar14 = psVar23;
              psVar23 = psVar18;
              goto LAB_00149d9b;
            }
            goto LAB_00149fca;
          }
          iVar6 = (int)unaff_R13 + 1;
          if (iVar7 <= iVar6) {
            iVar6 = iVar7;
          }
          psVar14 = (secp256k1_ge *)(ulong)(iVar6 - 0x3fU);
          if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_00149fc5;
          modinfo = (secp256k1_modinv64_modinfo *)
                    ((ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
          uVar24 = -(iVar10 * ((iVar21 * 2 + 2U & 8) + iVar21)) & (uint)modinfo;
          psVar4 = psVar22;
          psVar12 = psVar16;
          psVar14 = psVar18;
          psVar16 = psVar20;
          unaff_RBP = unaff_R15;
LAB_00149d9b:
          uVar15 = (ulong)uVar24;
          puVar19 = (uint64_t *)((long)(psVar16->x).n + uVar15 * (long)psVar12);
          psVar18 = (secp256k1_ge *)((long)(psVar14->x).n + (long)psVar23 * uVar15);
          psVar22 = (secp256k1_gej *)((long)(psVar4->x).n + uVar15 * (long)psVar3);
          psVar16 = psVar12;
          unaff_R15 = unaff_RBP;
          if (((ulong)puVar19 & (ulong)modinfo) != 0) {
LAB_00149fc0:
            psStack_d0 = (secp256k1_gej *)0x149fc5;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00149fc5:
            psStack_d0 = (secp256k1_gej *)0x149fca;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00149fca:
            psStack_d0 = (secp256k1_gej *)0x149fcf;
            secp256k1_jacobi64_maybe_var_cold_5();
            unaff_RBX = (secp256k1_ge *)modinfo;
            unaff_R12 = psVar22;
            unaff_R14 = psVar23;
            goto LAB_00149fcf;
          }
        }
        x = SUB168(SEXT816((long)psVar3) * SEXT816((long)psVar18),8);
        uVar15 = (long)psVar23 * (long)psVar22 - (long)psVar3 * (long)psVar18;
        uVar9 = (SUB168(SEXT816((long)psVar23) * SEXT816((long)psVar22),8) - (long)x) -
                (ulong)((ulong)((long)psVar23 * (long)psVar22) <
                       (ulong)((long)psVar3 * (long)psVar18));
        psVar14 = (secp256k1_ge *)(~uVar9 | uVar15 ^ 0xc000000000000000);
        unaff_RBP = (secp256k1_gej *)&local_b8;
        local_50.u = (int64_t)psVar23;
        local_50.v = (int64_t)psVar3;
        local_50.q = (int64_t)psVar18;
        local_50.r = (int64_t)psVar22;
        if ((psVar14 != (secp256k1_ge *)0x0) && (uVar15 != 0x4000000000000000 || uVar9 != 0))
        goto LAB_0014a001;
        unaff_R12 = (secp256k1_gej *)local_78;
        iVar10 = (int)unaff_R14;
        psStack_d0 = (secp256k1_gej *)0x149e49;
        psVar14 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar10,
                           (secp256k1_modinv64_signed62 *)local_90,0);
        if (iVar7 < 1) {
LAB_00149fcf:
          psStack_d0 = (secp256k1_gej *)0x149fd4;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00149fd4:
          psStack_d0 = (secp256k1_gej *)0x149fd9;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00149fd9:
          psStack_d0 = (secp256k1_gej *)0x149fde;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00149fde:
          psStack_d0 = (secp256k1_gej *)0x149fe3;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00149fe3;
        }
        psStack_d0 = (secp256k1_gej *)0x149e64;
        psVar14 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar10,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (0 < iVar7) goto LAB_00149fd4;
        psStack_d0 = (secp256k1_gej *)0x149e7c;
        psVar14 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)unaff_RBP;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar10,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,0);
        if (iVar7 < 1) goto LAB_00149fd9;
        psStack_d0 = (secp256k1_gej *)0x149e97;
        psVar14 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)unaff_RBP;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar10,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (-1 < iVar7) goto LAB_00149fde;
        psStack_d0 = (secp256k1_gej *)0x149eb2;
        secp256k1_modinv64_update_fg_62_var
                  (iVar10,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_RBP,&local_50);
        if (local_78._0_8_ == 1) {
          if (1 < iVar10) {
            psVar14 = (secp256k1_ge *)0x1;
            uVar15 = 0;
            do {
              uVar15 = uVar15 | *(ulong *)(local_78 + (long)psVar14 * 8);
              psVar14 = (secp256k1_ge *)((long)(psVar14->x).n + 1);
            } while (unaff_R14 != psVar14);
            if (uVar15 != 0) goto LAB_00149ee4;
          }
          uStack_c0._4_4_ = 1 - (uVar24 * 2 & 2);
          bVar25 = false;
        }
        else {
LAB_00149ee4:
          lVar11 = (long)iVar10;
          if ((-1 < lVar11 + -2 && (&local_80)[lVar11] == (secp256k1_ge *)0x0) &&
              (&uStack_c0)[lVar11] == 0) {
            unaff_R14 = (secp256k1_ge *)(ulong)(iVar10 - 1);
          }
          psStack_d0 = (secp256k1_gej *)0x149f11;
          iVar10 = (int)unaff_R14;
          psVar14 = unaff_R14;
          x = (secp256k1_modinv64_signed62 *)unaff_R12;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar10,
                             (secp256k1_modinv64_signed62 *)unaff_RBX,0);
          if (iVar7 < 1) goto LAB_00149fe8;
          psStack_d0 = (secp256k1_gej *)0x149f2c;
          psVar14 = unaff_R14;
          x = (secp256k1_modinv64_signed62 *)unaff_R12;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar10,
                             (secp256k1_modinv64_signed62 *)unaff_RBX,1);
          if (0 < iVar7) goto LAB_00149fed;
          psStack_d0 = (secp256k1_gej *)0x149f44;
          psVar14 = unaff_R14;
          x = (secp256k1_modinv64_signed62 *)unaff_RBP;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar10,
                             (secp256k1_modinv64_signed62 *)unaff_RBX,0);
          if (iVar7 < 1) goto LAB_00149ff2;
          psStack_d0 = (secp256k1_gej *)0x149f5f;
          psVar14 = unaff_R14;
          x = (secp256k1_modinv64_signed62 *)unaff_RBP;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar10,
                             (secp256k1_modinv64_signed62 *)unaff_RBX,1);
          bVar25 = true;
          if (-1 < iVar7) goto LAB_00149ff7;
        }
        if (!bVar25) {
          return uStack_c0._4_4_;
        }
        uVar24 = (int)local_88 + 1;
        local_88 = (ulong)uVar24;
        modinfo = (secp256k1_modinv64_modinfo *)unaff_RBX;
        unaff_RBP = unaff_R15;
        if (uVar24 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_d0 = (secp256k1_gej *)0x14a001;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_0014a001:
  psStack_d0 = (secp256k1_gej *)secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_f8 = (secp256k1_ge *)modinfo;
  psStack_f0 = psVar22;
  lStack_e8 = unaff_R13;
  psStack_e0 = psVar23;
  psStack_d8 = unaff_R15;
  psStack_d0 = unaff_RBP;
  secp256k1_ge_verify(psVar14);
  if (psVar14->infinity != 0) {
    secp256k1_gej_set_infinity((secp256k1_gej *)x);
    return extraout_EAX;
  }
  r = (secp256k1_scalar *)(auStack_e70 + 0x50);
  secp256k1_scalar_add(r,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(r,r);
  psVar22 = (secp256k1_gej *)(auStack_f00 + 0x70);
  secp256k1_scalar_split_lambda((secp256k1_scalar *)auStack_e70,(secp256k1_scalar *)psVar22,r);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_e70,(secp256k1_scalar *)auStack_e70,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar3 = psVar22;
  secp256k1_scalar_add
            ((secp256k1_scalar *)psVar22,(secp256k1_scalar *)psVar22,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar15 = 0x81;
  do {
    psVar16 = (secp256k1_gej *)auStack_e70;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_e70);
    if ((*(ulong *)(auStack_e70 + (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) != 0) {
      secp256k1_ecmult_const_cold_1();
LAB_0014a4d3:
      secp256k1_ecmult_const_cold_2();
      goto LAB_0014a4d8;
    }
    psVar16 = psVar22;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar22);
    if ((*(ulong *)(auStack_e70 + (uVar15 >> 6) * 8 + -0x20) >> ((uint)uVar15 & 0x3f) & 1) != 0)
    goto LAB_0014a4d3;
    uVar24 = (uint)uVar15 + 1;
    uVar15 = (ulong)uVar24;
  } while (uVar24 != 0x100);
  secp256k1_gej_set_ge((secp256k1_gej *)x,psVar14);
  secp256k1_ecmult_odd_multiples_table
            (0x10,&sStack_780,&sStack_e00.x,(secp256k1_fe *)(auStack_e70 + 0x20),(secp256k1_gej *)x)
  ;
  secp256k1_ge_table_set_globalz(0x10,&sStack_780,&sStack_e00.x);
  lVar11 = 0;
  do {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)sStack_e00.x.n + lVar11),
               (secp256k1_ge *)((long)sStack_780.x.n + lVar11));
    lVar11 = lVar11 + 0x68;
  } while (lVar11 != 0x680);
  r_00 = (secp256k1_fe *)(auStack_f00 + 0x30);
  iVar7 = 0x19;
  while( true ) {
    uVar24 = iVar7 * 5;
    uVar1 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)auStack_e70,uVar24,5);
    psVar16 = (secp256k1_gej *)(auStack_f00 + 0x70);
    psVar3 = (secp256k1_gej *)(ulong)uVar24;
    uVar2 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar16,uVar24,5);
    uVar24 = uVar1 >> 4 ^ 1;
    if (0x1f < uVar1) break;
    auStack_f00._32_8_ = sStack_780.x.n[4];
    auStack_f00._40_4_ = sStack_780.x.magnitude;
    auStack_f00._44_4_ = sStack_780.x.normalized;
    auStack_f00._16_8_ = sStack_780.x.n[2];
    auStack_f00._24_8_ = sStack_780.x.n[3];
    auStack_f00._0_8_ = sStack_780.x.n[0];
    auStack_f00._8_8_ = sStack_780.x.n[1];
    auStack_f00._80_8_ = sStack_780.y.n[4];
    auStack_f00._88_4_ = sStack_780.y.magnitude;
    auStack_f00._92_4_ = sStack_780.y.normalized;
    auStack_f00._64_8_ = sStack_780.y.n[2];
    auStack_f00._72_8_ = sStack_780.y.n[3];
    auStack_f00._48_8_ = sStack_780.y.n[0];
    auStack_f00._56_8_ = sStack_780.y.n[1];
    uVar15 = 1;
    psVar13 = asStack_6e8;
    do {
      uVar8 = (uint)(((uVar1 ^ -uVar24) & 0xf) == uVar15);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_f00,psVar13 + -1,uVar8);
      secp256k1_fe_cmov(r_00,psVar13,uVar8);
      uVar15 = uVar15 + 1;
      psVar13 = (secp256k1_fe *)(psVar13[2].n + 1);
    } while (uVar15 != 0x10);
    auStack_f00._96_4_ = 0;
    secp256k1_fe_verify(r_00);
    secp256k1_fe_verify_magnitude(r_00,1);
    sStack_f30.n[0] = 0x3ffffbfffff0bc - auStack_f00._48_8_;
    sStack_f30.n[1] = 0x3ffffffffffffc - auStack_f00._56_8_;
    sStack_f30.n[2] = 0x3ffffffffffffc - auStack_f00._64_8_;
    sStack_f30.n[3] = 0x3ffffffffffffc - auStack_f00._72_8_;
    sStack_f30.n[4] = 0x3fffffffffffc - auStack_f00._80_8_;
    sStack_f30.magnitude = 2;
    sStack_f30.normalized = 0;
    secp256k1_fe_verify(&sStack_f30);
    secp256k1_fe_cmov(r_00,&sStack_f30,uVar24);
    psVar16 = (secp256k1_gej *)x;
    if (iVar7 == 0x19) {
      psVar3 = (secp256k1_gej *)auStack_f00;
      secp256k1_gej_set_ge((secp256k1_gej *)x,(secp256k1_ge *)auStack_f00);
    }
    else {
      iVar10 = 5;
      do {
        secp256k1_gej_double((secp256k1_gej *)x,(secp256k1_gej *)x);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      psVar3 = (secp256k1_gej *)x;
      secp256k1_gej_add_ge((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)auStack_f00);
    }
    uVar24 = uVar2 >> 4 ^ 1;
    if (0x1f < uVar2) goto LAB_0014a4dd;
    auStack_f00._32_8_ = sStack_e00.x.n[4];
    auStack_f00._40_4_ = sStack_e00.x.magnitude;
    auStack_f00._44_4_ = sStack_e00.x.normalized;
    auStack_f00._16_8_ = sStack_e00.x.n[2];
    auStack_f00._24_8_ = sStack_e00.x.n[3];
    auStack_f00._0_8_ = sStack_e00.x.n[0];
    auStack_f00._8_8_ = sStack_e00.x.n[1];
    auStack_f00._80_8_ = sStack_e00.y.n[4];
    auStack_f00._88_4_ = sStack_e00.y.magnitude;
    auStack_f00._92_4_ = sStack_e00.y.normalized;
    auStack_f00._64_8_ = sStack_e00.y.n[2];
    auStack_f00._72_8_ = sStack_e00.y.n[3];
    auStack_f00._48_8_ = sStack_e00.y.n[0];
    auStack_f00._56_8_ = sStack_e00.y.n[1];
    uVar15 = 1;
    psVar13 = asStack_d68;
    do {
      uVar8 = (uint)(((uVar2 ^ -uVar24) & 0xf) == uVar15);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_f00,psVar13 + -1,uVar8);
      secp256k1_fe_cmov(r_00,psVar13,uVar8);
      uVar15 = uVar15 + 1;
      psVar13 = (secp256k1_fe *)(psVar13[2].n + 1);
    } while (uVar15 != 0x10);
    auStack_f00._96_4_ = 0;
    secp256k1_fe_verify(r_00);
    secp256k1_fe_verify_magnitude(r_00,1);
    sStack_f30.n[0] = 0x3ffffbfffff0bc - auStack_f00._48_8_;
    sStack_f30.n[1] = 0x3ffffffffffffc - auStack_f00._56_8_;
    sStack_f30.n[2] = 0x3ffffffffffffc - auStack_f00._64_8_;
    sStack_f30.n[3] = 0x3ffffffffffffc - auStack_f00._72_8_;
    sStack_f30.n[4] = 0x3fffffffffffc - auStack_f00._80_8_;
    sStack_f30.magnitude = 2;
    sStack_f30.normalized = 0;
    secp256k1_fe_verify(&sStack_f30);
    secp256k1_fe_cmov(r_00,&sStack_f30,uVar24);
    secp256k1_gej_add_ge((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)auStack_f00);
    bVar25 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar25) {
      secp256k1_fe_mul(&((secp256k1_gej *)x)->z,&((secp256k1_gej *)x)->z,
                       (secp256k1_fe *)(auStack_e70 + 0x20));
      return extraout_EAX_00;
    }
  }
LAB_0014a4d8:
  secp256k1_ecmult_const_cold_4();
LAB_0014a4dd:
  secp256k1_ecmult_const_cold_3();
  secp256k1_ge_verify((secp256k1_ge *)psVar3);
  psVar22 = psVar16;
  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
    (psVar22->x).n[0] = (psVar3->x).n[0];
    psVar3 = (secp256k1_gej *)((long)psVar3 + (ulong)bVar26 * -0x10 + 8);
    psVar22 = (secp256k1_gej *)((long)psVar22 + (ulong)bVar26 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar16->x,&psVar16->x,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)psVar16);
  return extraout_EAX_01;
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}